

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall Imath_2_5::Euler<double>::angleOrder(Euler<double> *this,int *i,int *j,int *k)

{
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int *k_local;
  int *j_local;
  int *i_local;
  Euler<double> *this_local;
  
  *i = (uint)((byte)this->field_0x18 >> 3 & 3);
  if (((byte)this->field_0x18 >> 2 & 1) == 0) {
    if (*i < 1) {
      local_30 = 2;
    }
    else {
      local_30 = *i + -1;
    }
    local_2c = local_30;
  }
  else {
    local_2c = (*i + 1) % 3;
  }
  *j = local_2c;
  if (((byte)this->field_0x18 >> 2 & 1) == 0) {
    local_38 = (*i + 1) % 3;
  }
  else {
    if (*i < 1) {
      local_34 = 2;
    }
    else {
      local_34 = *i + -1;
    }
    local_38 = local_34;
  }
  *k = local_38;
  return;
}

Assistant:

inline void
 Euler<T>::angleOrder(int &i, int &j, int &k) const
{
    i = _initialAxis;
    j = _parityEven ? (i+1)%3 : (i > 0 ? i-1 : 2);
    k = _parityEven ? (i > 0 ? i-1 : 2) : (i+1)%3;
}